

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

void __thiscall TTD::EventLog::ReplaySnapshotEvent(EventLog *this)

{
  SnapShot *snap1;
  EventLogEntry *pEVar1;
  SnapShot *snap2;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  ScriptContext **ppSVar3;
  int32 i;
  int index;
  undefined1 local_530 [8];
  TTDCompareMap compareMap;
  BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  liveTopLevelBodies;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  pEVar1 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
  if (pEVar1->EventKind != SnapshotTag) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  ThreadContextTTD::SyncCtxtsAndRootsWithSnapshot_Replay
            (this->m_threadContext->TTDContext,pEVar1[2].EventKind,
             (TTD_LOG_PTR_ID *)pEVar1[2].EventTimeStamp,pEVar1[3].EventKind,
             (TTD_LOG_PTR_ID *)pEVar1[3].EventTimeStamp);
  Memory::Recycler::CollectNow<(Memory::CollectionFlags)16384>(this->m_threadContext->recycler);
  SnapshotExtractor::DoResetWeakCollectionPinSet(&this->m_snapExtractor,this->m_threadContext);
  SetSnapshotOrInflateInProgress(this,true);
  TTModeStack::Push(&this->m_modeStack,ExcludedExecutionTTAction);
  UpdateComputedMode(this);
  compareMap.H2PendingAsyncModBufferSet.
  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .stats = (Type)0x0;
  index = 0;
  snap2 = DoSnapshotExtract_Helper
                    (this,0.0,(BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                               *)&compareMap.H2PendingAsyncModBufferSet.
                                  super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                  .stats);
  while( true ) {
    pLVar2 = ThreadContextTTD::GetTTDContexts(this->m_threadContext->TTDContext);
    if ((pLVar2->super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>).
        count <= index) break;
    pLVar2 = ThreadContextTTD::GetTTDContexts(this->m_threadContext->TTDContext);
    ppSVar3 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
              Item(&pLVar2->
                    super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>,
                   index);
    ScriptContextTTD::CleanUnreachableTopLevelBodies
              ((*ppSVar3)->TTDContextInfo,
               (BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)&compareMap.H2PendingAsyncModBufferSet.
                   super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   .stats);
    index = index + 1;
  }
  pEVar1 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator);
  NSLogEvents::SnapshotEventLogEntry_EnsureSnapshotDeserialized(pEVar1,this->m_threadContext);
  if (pEVar1->EventKind == SnapshotTag) {
    snap1 = (SnapShot *)pEVar1[1].EventTimeStamp;
    TTDCompareMap::TTDCompareMap((TTDCompareMap *)local_530,this->m_threadContext);
    SnapShot::InitializeForSnapshotCompare(snap1,snap2,(TTDCompareMap *)local_530);
    SnapShot::DoSnapshotCompare(snap1,snap2,(TTDCompareMap *)local_530);
    SnapShot::~SnapShot(snap2);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,snap2,0x1f8);
    PopMode(this,ExcludedExecutionTTAction);
    SetSnapshotOrInflateInProgress(this,false);
    TTDCompareMap::~TTDCompareMap((TTDCompareMap *)local_530);
    JsUtil::
    BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       *)&compareMap.H2PendingAsyncModBufferSet.
                          super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                          .stats);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
    AdvanceTimeAndPositionForReplay(this);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void EventLog::ReplaySnapshotEvent()
    {
        SnapShot* snap = nullptr;
        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));

            //clear the weak collection pin set and force a GC (to get weak containers in a consistent state)
            NSLogEvents::EventLogEntry* revt = this->m_currentReplayEventIterator.Current();
            NSLogEvents::SnapshotEventLogEntry* snapUpdateEvt = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(revt);

            this->m_threadContext->TTDContext->SyncCtxtsAndRootsWithSnapshot_Replay(snapUpdateEvt->LiveContextCount, snapUpdateEvt->LiveContextIdArray, snapUpdateEvt->LongLivedRefRootsCount, snapUpdateEvt->LongLivedRefRootsIdArray);
            this->m_threadContext->GetRecycler()->CollectNow<CollectNowForceInThread>();

            //need to do a visit of some sort to reset the weak collection pin set
            this->m_snapExtractor.DoResetWeakCollectionPinSet(this->m_threadContext);

            //We always need to cleanup references (above but only do compare in extra diagnostics mode)
#if ENABLE_SNAPSHOT_COMPARE
            this->SetSnapshotOrInflateInProgress(true);
            this->PushMode(TTDMode::ExcludedExecutionTTAction);

            JsUtil::BaseHashSet<Js::FunctionBody*, HeapAllocator> liveTopLevelBodies(&HeapAllocator::Instance);
            snap = this->DoSnapshotExtract_Helper(0.0, liveTopLevelBodies);

            for(int32 i = 0; i < this->m_threadContext->TTDContext->GetTTDContexts().Count(); ++i)
            {
                this->m_threadContext->TTDContext->GetTTDContexts().Item(i)->TTDContextInfo->CleanUnreachableTopLevelBodies(liveTopLevelBodies);
            }

            NSLogEvents::EventLogEntry* evt = this->m_currentReplayEventIterator.Current();
            NSLogEvents::SnapshotEventLogEntry_EnsureSnapshotDeserialized(evt, this->m_threadContext);

            const NSLogEvents::SnapshotEventLogEntry* recordedSnapEntry = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(evt);
            const SnapShot* recordedSnap = recordedSnapEntry->Snap;

            TTDCompareMap compareMap(this->m_threadContext);
            SnapShot::InitializeForSnapshotCompare(recordedSnap, snap, compareMap);
            SnapShot::DoSnapshotCompare(recordedSnap, snap, compareMap);

            TT_HEAP_DELETE(SnapShot, snap);

            this->PopMode(TTDMode::ExcludedExecutionTTAction);
            this->SetSnapshotOrInflateInProgress(false);
#endif
        }
        catch(...)
        {
            if(snap != nullptr)
            {
                TT_HEAP_DELETE(SnapShot, snap);
            }
            TTDAssert(false, "OOM in snapshot replay...");
        }

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteLiteralMsg("---SNAPSHOT EVENT---\n");
#endif

        this->AdvanceTimeAndPositionForReplay(); //move along
    }